

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_xverse::llm_build_xverse
          (llm_build_xverse *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  pointer plVar3;
  ggml_tensor *pgVar4;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  int il;
  int il_00;
  long lVar11;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar12;
  long local_70;
  ggml_tensor *local_60;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  if (uVar1 == plVar2->n_embd_head_k) {
    if (uVar1 == plVar2->n_rot) {
      local_60 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      pgVar4 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      local_70 = 0;
      for (lVar11 = 0; uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20),
          lVar11 < (this->super_llm_graph_context).n_layer; lVar11 = lVar11 + 1) {
        il_00 = (int)lVar11;
        pgVar5 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,local_60,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->attn_norm +
                             local_70),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"attn_norm",il_00);
        pgVar6 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wq + local_70),
                            pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il_00);
        pgVar7 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wk + local_70),
                            pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il_00);
        pgVar5 = llm_graph_context::build_lora_mm
                           (&this->super_llm_graph_context,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wv + local_70),
                            pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il_00);
        uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,uVar1,
                                (this->super_llm_graph_context).n_head,
                                (long)(this->super_llm_graph_context).n_tokens);
        uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar7,uVar1,
                                (this->super_llm_graph_context).n_head_kv,
                                (long)(this->super_llm_graph_context).n_tokens);
        pgVar5 = (ggml_tensor *)
                 ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,uVar1,
                                 (this->super_llm_graph_context).n_head_kv,
                                 (long)(this->super_llm_graph_context).n_tokens);
        pgVar6 = (ggml_tensor *)
                 ggml_rope_ext((this->super_llm_graph_context).freq_base,
                               (this->super_llm_graph_context).freq_scale,
                               (this->super_llm_graph_context).ext_factor,
                               (this->super_llm_graph_context).attn_factor,
                               (this->super_llm_graph_context).beta_fast,
                               (this->super_llm_graph_context).beta_slow,
                               (this->super_llm_graph_context).ctx0,uVar8,pgVar4,0,
                               (int)(this->super_llm_graph_context).n_rot,
                               (this->super_llm_graph_context).rope_type,
                               CONCAT44(uVar12,(this->super_llm_graph_context).n_ctx_orig));
        pgVar7 = (ggml_tensor *)
                 ggml_rope_ext((this->super_llm_graph_context).freq_base,
                               (this->super_llm_graph_context).freq_scale,
                               (this->super_llm_graph_context).ext_factor,
                               (this->super_llm_graph_context).attn_factor,
                               (this->super_llm_graph_context).beta_fast,
                               (this->super_llm_graph_context).beta_slow,
                               (this->super_llm_graph_context).ctx0,uVar9,pgVar4,0,
                               (int)(this->super_llm_graph_context).n_rot,
                               (this->super_llm_graph_context).rope_type,
                               (this->super_llm_graph_context).n_ctx_orig);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Qcur",il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar7,"Kcur",il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Vcur",il_00);
        pgVar5 = llm_graph_context::build_attn
                           (&this->super_llm_graph_context,inp,gf,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->wo + local_70),
                            (ggml_tensor *)0x0,pgVar6,pgVar7,pgVar5,(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,1.0 / SQRT((float)uVar1),il_00);
        if (lVar11 == (this->super_llm_graph_context).n_layer + -1) {
          pgVar6 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
          pgVar5 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar5,pgVar6);
          local_60 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,local_60,pgVar6);
        }
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,local_60);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_inp",il_00);
        pgVar6 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar5,
                            *(ggml_tensor **)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_70
                             ),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_norm",il_00);
        plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        in_stack_ffffffffffffff48 = 0;
        pgVar6 = llm_graph_context::build_ffn
                           (&this->super_llm_graph_context,pgVar6,
                            *(ggml_tensor **)((long)&plVar3->ffn_up + local_70),(ggml_tensor *)0x0,
                            (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar3->ffn_gate + local_70)
                            ,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                            *(ggml_tensor **)((long)&plVar3->ffn_down + local_70),(ggml_tensor *)0x0
                            ,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_out",il_00);
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar5);
        local_60 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar5,il_00);
        llm_graph_context::cb(&this->super_llm_graph_context,local_60,"l_out",il_00);
        local_70 = local_70 + 0x4f0;
      }
      pgVar4 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_60,model->output_norm,
                          (ggml_tensor *)0x0,LLM_NORM_RMS,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar4;
      pgVar4 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar4)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar4;
      ggml_build_forward_expand(gf,pgVar4);
      return;
    }
    pcVar10 = "n_embd_head == hparams.n_rot";
    uVar8 = 0x1346;
  }
  else {
    pcVar10 = "n_embd_head == hparams.n_embd_head_k";
    uVar8 = 0x1345;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

llm_build_xverse(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur, model.output_norm, NULL, LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }